

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedSimulationDataGenerator.cpp
# Opt level: O1

U32 __thiscall
AsyncRgbLedSimulationDataGenerator::GenerateSimulationData
          (AsyncRgbLedSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  U32 UVar1;
  RGBValue in_RAX;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  RGBValue local_38;
  
  local_38 = in_RAX;
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  while (uVar3 < uVar2) {
    WriteReset(this);
    iVar4 = 6;
    do {
      local_38 = RandomRGBValue(this);
      WriteRGBTriple(this,&local_38);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    UVar1 = this->mFrameCount + 1;
    this->mFrameCount = UVar1;
    if ((UVar1 * -0x49249249 < 0x24924925) && (this->mDoGenerateHighSpeedMode == true)) {
      this->mHighSpeedMode = (bool)(this->mHighSpeedMode ^ 1);
    }
    uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  }
  *simulation_channel = &this->mLEDSimulationData;
  return 1;
}

Assistant:

U32 AsyncRgbLedSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                                SimulationChannelDescriptor** simulation_channel )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mLEDSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        WriteReset();

        // six RGB-triple cascade between resets, i.e six discrete LEDs
        // or two of the 3-LED combined drivers. We could perhaps make
        // this adjustable
        for( int t = 0; t < 6; ++t )
        {
            CreateRGBWord();
        }

        ++mFrameCount;

        // toggle high-speed mode every seven frames if it's supported
        if( ( ( mFrameCount % 7 ) == 0 ) && mDoGenerateHighSpeedMode )
        {
            mHighSpeedMode = !mHighSpeedMode;
        }
    }

    *simulation_channel = &mLEDSimulationData;
    return 1;
}